

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O1

void response_written(cio_buffered_stream *buffered_stream,void *handler_context,cio_error err)

{
  cio_error cVar1;
  char *msg;
  
  cVar1 = cio_timer_cancel((cio_timer *)((long)handler_context + 0x2d0));
  *(undefined1 *)((long)handler_context + 0x323) = 1;
  if (*(code **)((long)handler_context + 0x350) != (code *)0x0) {
    (**(code **)((long)handler_context + 0x350))(handler_context,err);
  }
  if (cVar1 == CIO_SUCCESS) {
    if (err == CIO_SUCCESS) {
      if ((*(char *)((long)handler_context + 0x319) == '\0') &&
         (*(char *)((long)handler_context + 0x318) != '\0')) {
        restart_read_request((cio_http_client *)handler_context);
        return;
      }
      mark_to_be_closed((cio_http_client *)handler_context);
      return;
    }
    msg = "Writing response failed!";
  }
  else {
    msg = "Cancelling response timer failed!";
  }
  handle_server_error((cio_http_client *)handler_context,msg);
  return;
}

Assistant:

static void response_written(struct cio_buffered_stream *buffered_stream, void *handler_context, enum cio_error err)
{
	(void)buffered_stream;
	struct cio_http_client *client = (struct cio_http_client *)handler_context;
	enum cio_error cancel_err = cio_timer_cancel(&client->http_private.response_timer);

	client->http_private.response_written_completed = true;

	if (client->response_written_cb) {
		client->response_written_cb(client, err);
	}

	if (cio_unlikely(cancel_err != CIO_SUCCESS)) {
		handle_server_error(client, "Cancelling response timer failed!");
		return;
	}

	if (cio_unlikely(err != CIO_SUCCESS)) {
		handle_server_error(client, "Writing response failed!");
		return;
	}

	if (cio_unlikely(client->http_private.close_immediately || !client->http_private.should_keepalive)) {
		mark_to_be_closed(client);
		return;
	}

	restart_read_request(client);
}